

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swap-reduce.cpp
# Opt level: O2

void verify_block(Block *b,ProxyWithLink *cp)

{
  pointer pfVar1;
  pointer pPVar2;
  long lVar3;
  long lVar4;
  AssertionHandler local_b0;
  undefined **local_68;
  undefined1 local_60;
  undefined1 local_5f;
  long local_58;
  char *local_50;
  undefined8 local_48;
  long local_40;
  ulong local_38;
  
  if (cp->link_ == (Link *)0x0) {
    lVar3 = 0;
  }
  else {
    lVar3 = __dynamic_cast(cp->link_,&diy::Link::typeinfo,
                           &diy::RegularLink<diy::Bounds<float>>::typeinfo,0);
  }
  for (lVar4 = 0; lVar4 != 0xc; lVar4 = lVar4 + 4) {
    local_b0.m_assertionInfo.macroName.m_start = "CHECK";
    local_b0.m_assertionInfo.macroName.m_size = 5;
    local_b0.m_assertionInfo.lineInfo.file =
         "/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/swap-reduce.cpp";
    local_b0.m_assertionInfo.lineInfo.line = 0x81;
    local_b0.m_assertionInfo.capturedExpression.m_start = "b->box.min[j] == core.min[j]";
    local_b0.m_assertionInfo.capturedExpression.m_size = 0x1c;
    local_b0.m_assertionInfo.resultDisposition = ContinueOnFailure;
    local_b0.m_reaction.shouldDebugBreak = false;
    local_b0.m_reaction.shouldThrow = false;
    local_b0.m_completed = false;
    local_b0.m_resultCapture = Catch::getResultCapture();
    pfVar1 = (b->box).min.super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_begin;
    local_58 = (long)pfVar1 + lVar4;
    local_5f = *(float *)((long)pfVar1 + lVar4) == *(float *)(*(long *)(lVar3 + 0x78) + lVar4);
    local_40 = *(long *)(lVar3 + 0x78) + lVar4;
    local_60 = 1;
    local_68 = &PTR_streamReconstructedExpression_001c4858;
    local_50 = "==";
    local_48 = 2;
    (*(local_b0.m_resultCapture)->_vptr_IResultCapture[10])
              (local_b0.m_resultCapture,&local_b0,&local_68,&local_b0.m_reaction);
    Catch::AssertionHandler::complete(&local_b0);
    Catch::AssertionHandler::~AssertionHandler(&local_b0);
    local_b0.m_assertionInfo.macroName.m_start = "CHECK";
    local_b0.m_assertionInfo.macroName.m_size = 5;
    local_b0.m_assertionInfo.lineInfo.file =
         "/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/swap-reduce.cpp";
    local_b0.m_assertionInfo.lineInfo.line = 0x82;
    local_b0.m_assertionInfo.capturedExpression.m_start = "b->box.max[j] == core.max[j]";
    local_b0.m_assertionInfo.capturedExpression.m_size = 0x1c;
    local_b0.m_assertionInfo.resultDisposition = ContinueOnFailure;
    local_b0.m_reaction.shouldDebugBreak = false;
    local_b0.m_reaction.shouldThrow = false;
    local_b0.m_completed = false;
    local_b0.m_resultCapture = Catch::getResultCapture();
    pfVar1 = (b->box).max.super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_begin;
    local_58 = (long)pfVar1 + lVar4;
    local_5f = *(float *)((long)pfVar1 + lVar4) == *(float *)(*(long *)(lVar3 + 0xb8) + lVar4);
    local_40 = *(long *)(lVar3 + 0xb8) + lVar4;
    local_60 = 1;
    local_68 = &PTR_streamReconstructedExpression_001c4858;
    local_50 = "==";
    local_48 = 2;
    (*(local_b0.m_resultCapture)->_vptr_IResultCapture[10])
              (local_b0.m_resultCapture,&local_b0,&local_68,&local_b0.m_reaction);
    Catch::AssertionHandler::complete(&local_b0);
    Catch::AssertionHandler::~AssertionHandler(&local_b0);
  }
  lVar3 = 0;
  for (local_38 = 0;
      local_38 <
      (ulong)(((long)(b->points).
                     super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(b->points).
                    super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0xc); local_38 = local_38 + 1) {
    for (lVar4 = 0; lVar4 != 0xc; lVar4 = lVar4 + 4) {
      local_b0.m_assertionInfo.macroName.m_start = "CHECK";
      local_b0.m_assertionInfo.macroName.m_size = 5;
      local_b0.m_assertionInfo.lineInfo.file =
           "/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/swap-reduce.cpp";
      local_b0.m_assertionInfo.lineInfo.line = 0x88;
      local_b0.m_assertionInfo.capturedExpression.m_start = "b->points[i][j] >= b->box.min[j]";
      local_b0.m_assertionInfo.capturedExpression.m_size = 0x20;
      local_b0.m_assertionInfo.resultDisposition = ContinueOnFailure;
      local_b0.m_reaction.shouldDebugBreak = false;
      local_b0.m_reaction.shouldThrow = false;
      local_b0.m_completed = false;
      local_b0.m_resultCapture = Catch::getResultCapture();
      pPVar2 = (b->points).
               super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pfVar1 = (b->box).min.super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_begin;
      local_58 = (long)(pPVar2->super_array<float,_3UL>)._M_elems + lVar4 + lVar3;
      local_5f = *(float *)((long)pfVar1 + lVar4) <=
                 *(float *)((long)(pPVar2->super_array<float,_3UL>)._M_elems + lVar4 + lVar3);
      local_60 = 1;
      local_40 = (long)pfVar1 + lVar4;
      local_68 = &PTR_streamReconstructedExpression_001c4858;
      local_50 = ">=";
      local_48 = 2;
      (*(local_b0.m_resultCapture)->_vptr_IResultCapture[10])
                (local_b0.m_resultCapture,&local_b0,&local_68,&local_b0.m_reaction);
      Catch::AssertionHandler::complete(&local_b0);
      Catch::AssertionHandler::~AssertionHandler(&local_b0);
      local_b0.m_assertionInfo.macroName.m_start = "CHECK";
      local_b0.m_assertionInfo.macroName.m_size = 5;
      local_b0.m_assertionInfo.lineInfo.file =
           "/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/swap-reduce.cpp";
      local_b0.m_assertionInfo.lineInfo.line = 0x89;
      local_b0.m_assertionInfo.capturedExpression.m_start = "b->points[i][j] <= b->box.max[j]";
      local_b0.m_assertionInfo.capturedExpression.m_size = 0x20;
      local_b0.m_assertionInfo.resultDisposition = ContinueOnFailure;
      local_b0.m_reaction.shouldDebugBreak = false;
      local_b0.m_reaction.shouldThrow = false;
      local_b0.m_completed = false;
      local_b0.m_resultCapture = Catch::getResultCapture();
      pPVar2 = (b->points).
               super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pfVar1 = (b->box).max.super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_begin;
      local_40 = (long)pfVar1 + lVar4;
      local_5f = *(float *)((long)(pPVar2->super_array<float,_3UL>)._M_elems + lVar4 + lVar3) <=
                 *(float *)((long)pfVar1 + lVar4);
      local_60 = 1;
      local_58 = (long)(pPVar2->super_array<float,_3UL>)._M_elems + lVar4 + lVar3;
      local_68 = &PTR_streamReconstructedExpression_001c4858;
      local_50 = "<=";
      local_48 = 2;
      (*(local_b0.m_resultCapture)->_vptr_IResultCapture[10])
                (local_b0.m_resultCapture,&local_b0,&local_68,&local_b0.m_reaction);
      Catch::AssertionHandler::complete(&local_b0);
      Catch::AssertionHandler::~AssertionHandler(&local_b0);
    }
    lVar3 = lVar3 + 0xc;
  }
  return;
}

Assistant:

void          verify_block(Block* b,
                           const diy::Master::ProxyWithLink& cp) // communication proxy
{
    const RCLink* link = dynamic_cast<RCLink*>(cp.link());

    for (unsigned j = 0; j < DIM; ++j)
    {
        const Bounds& core = link->core();
        CHECK(b->box.min[j] == core.min[j]);
        CHECK(b->box.max[j] == core.max[j]);
    }

    for (size_t i = 0; i < b->points.size(); ++i)
        for (unsigned j = 0; j < DIM; ++j)
        {
            CHECK(b->points[i][j] >= b->box.min[j]);
            CHECK(b->points[i][j] <= b->box.max[j]);
        }
}